

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_auth_pubkey_ok_ed25519.c
# Opt level: O0

int test(LIBSSH2_SESSION *session)

{
  int iVar1;
  LIBSSH2_SESSION *session_local;
  
  iVar1 = test_auth_pubkey(session,0,"libssh2",(char *)0x0,"key_ed25519.pub","key_ed25519");
  return iVar1;
}

Assistant:

int test(LIBSSH2_SESSION *session)
{
#if LIBSSH2_ED25519
    /* set in Dockerfile */
    return test_auth_pubkey(session, 0,
                            "libssh2",
                            NULL,
                            "key_ed25519.pub",
                            "key_ed25519");
#else
    (void)session;
    return 0;
#endif
}